

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::FLevel::FindMapBounds(FLevel *this)

{
  long lVar1;
  int iVar2;
  line_t_conflict *plVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar6 = (this->Vertices->p).X;
  dVar4 = (this->Vertices->p).Y;
  dVar7 = dVar6;
  dVar9 = dVar4;
  if (1 < (long)this->NumLines) {
    lVar1 = 1;
    do {
      iVar2 = 1;
      dVar5 = dVar6;
      dVar8 = dVar9;
      do {
        plVar3 = (line_t_conflict *)&this->Lines[lVar1].v2;
        if (iVar2 == 1) {
          plVar3 = this->Lines + lVar1;
        }
        dVar9 = (plVar3->v1->p).X;
        dVar6 = dVar9;
        if ((dVar5 <= dVar9) && (dVar6 = dVar5, dVar7 < dVar9)) {
          dVar7 = dVar9;
        }
        dVar5 = (plVar3->v1->p).Y;
        dVar9 = dVar5;
        if ((dVar8 <= dVar5) && (dVar9 = dVar8, dVar4 < dVar5)) {
          dVar4 = dVar5;
        }
        iVar2 = iVar2 + -1;
        dVar5 = dVar6;
        dVar8 = dVar9;
      } while (iVar2 == 0);
      lVar1 = lVar1 + 1;
    } while (lVar1 != this->NumLines);
  }
  this->MinX = SUB84(dVar6 + 103079215104.0,0);
  this->MinY = SUB84(dVar9 + 103079215104.0,0);
  this->MaxX = SUB84(dVar7 + 103079215104.0,0);
  this->MaxY = SUB84(dVar4 + 103079215104.0,0);
  return;
}

Assistant:

void FNodeBuilder::FLevel::FindMapBounds()
{
	double minx, maxx, miny, maxy;

	minx = maxx = Vertices[0].fX();
	miny = maxy = Vertices[0].fY();

	for (int i = 1; i < NumLines; ++i)
	{
		for (int j = 0; j < 2; j++)
		{
			vertex_t *v = (j == 0 ? Lines[i].v1 : Lines[i].v2);
			if (v->fX() < minx) minx = v->fX();
			else if (v->fX() > maxx) maxx = v->fX();
			if (v->fY() < miny) miny = v->fY();
			else if (v->fY() > maxy) maxy = v->fY();
		}
	}

	MinX = FLOAT2FIXED(minx);
	MinY = FLOAT2FIXED(miny);
	MaxX = FLOAT2FIXED(maxx);
	MaxY = FLOAT2FIXED(maxy);
}